

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

bool __thiscall kratos::Generator::is_auxiliary_var(Generator *this,shared_ptr<kratos::Var> *var)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  uint uVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  bool bVar8;
  key_type local_1c;
  
  uVar3 = (*(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[7])();
  uVar1 = (this->auxiliary_vars_)._M_h._M_bucket_count;
  uVar5 = (ulong)uVar3 % uVar1;
  p_Var6 = (this->auxiliary_vars_)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, uVar3 != *(uint *)&p_Var6->_M_nxt[1]._M_nxt)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, uVar3 == *(uint *)&p_Var2[1]._M_nxt)) goto LAB_0016f6d6;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_0016f6d6:
  if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
    bVar8 = false;
  }
  else {
    local_1c = (*(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 super_IRNode)._vptr_IRNode[7])();
    pmVar4 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->auxiliary_vars_,&local_1c);
    bVar8 = (pmVar4->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
            (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  return bVar8;
}

Assistant:

bool Generator::is_auxiliary_var(const std::shared_ptr<Var> &var) {
    return auxiliary_vars_.find(var->width()) != auxiliary_vars_.end() &&
           auxiliary_vars_.at(var->width()) == var;
}